

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::Printer::TextGenerator::TextGenerator
          (TextGenerator *this,ZeroCopyOutputStream *output,bool insert_silent_marker,
          int initial_indent_level)

{
  int initial_indent_level_local;
  bool insert_silent_marker_local;
  ZeroCopyOutputStream *output_local;
  TextGenerator *this_local;
  
  BaseTextGenerator::BaseTextGenerator(&this->super_BaseTextGenerator);
  (this->super_BaseTextGenerator)._vptr_BaseTextGenerator =
       (_func_int **)&PTR__TextGenerator_008ab6f0;
  this->output_ = output;
  this->buffer_ = (char *)0x0;
  this->buffer_size_ = 0;
  this->at_start_of_line_ = true;
  this->failed_ = false;
  this->insert_silent_marker_ = insert_silent_marker;
  this->indent_level_ = initial_indent_level;
  this->initial_indent_level_ = initial_indent_level;
  return;
}

Assistant:

explicit TextGenerator(io::ZeroCopyOutputStream* output,
                         bool insert_silent_marker, int initial_indent_level)
      : output_(output),
        buffer_(nullptr),
        buffer_size_(0),
        at_start_of_line_(true),
        failed_(false),
        insert_silent_marker_(insert_silent_marker),
        indent_level_(initial_indent_level),
        initial_indent_level_(initial_indent_level) {}